

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O0

void WebRtcIsac_Spec2time
               (TransformTables *tables,double *inre,double *inim,double *outre1,double *outre2,
               FFTstr *fftstr_obj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_7c [2];
  int dims;
  double fact;
  double yi;
  double yr;
  double xi;
  double xr;
  double tmp1i;
  double tmp1r;
  FFTstr *pFStack_38;
  int k;
  FFTstr *fftstr_obj_local;
  double *outre2_local;
  double *outre1_local;
  double *inim_local;
  double *inre_local;
  TransformTables *tables_local;
  
  local_7c[0] = 0xf0;
  for (tmp1r._4_4_ = 0; tmp1r._4_4_ < 0x78; tmp1r._4_4_ = tmp1r._4_4_ + 1) {
    tmp1i = tables->costab2[tmp1r._4_4_];
    xr = tables->sintab2[tmp1r._4_4_];
    xi = inre[tmp1r._4_4_] * tmp1i + inim[tmp1r._4_4_] * xr;
    yr = inim[tmp1r._4_4_] * tmp1i + -(inre[tmp1r._4_4_] * xr);
    yi = -inim[0xef - tmp1r._4_4_] * tmp1i + -(inre[0xef - tmp1r._4_4_] * xr);
    fact = -inre[0xef - tmp1r._4_4_] * tmp1i + inim[0xef - tmp1r._4_4_] * xr;
    outre1[tmp1r._4_4_] = xi - fact;
    outre1[0xef - tmp1r._4_4_] = xi + fact;
    outre2[tmp1r._4_4_] = yr + yi;
    outre2[0xef - tmp1r._4_4_] = -yr + yi;
  }
  pFStack_38 = fftstr_obj;
  fftstr_obj_local = (FFTstr *)outre2;
  outre2_local = outre1;
  outre1_local = inim;
  inim_local = inre;
  inre_local = tables->costab1;
  WebRtcIsac_Fftns(1,local_7c,outre1,outre2,1,240.0,fftstr_obj);
  dVar5 = sqrt(240.0);
  for (tmp1r._4_4_ = 0; tmp1r._4_4_ < 0xf0; tmp1r._4_4_ = tmp1r._4_4_ + 1) {
    dVar1 = inre_local[tmp1r._4_4_];
    dVar2 = inre_local[(long)tmp1r._4_4_ + 0xf0];
    dVar3 = outre2_local[tmp1r._4_4_];
    dVar4 = fftstr_obj_local->Tmp0[(long)tmp1r._4_4_ + -1];
    fftstr_obj_local->Tmp0[(long)tmp1r._4_4_ + -1] =
         (fftstr_obj_local->Tmp0[(long)tmp1r._4_4_ + -1] * dVar1 + outre2_local[tmp1r._4_4_] * dVar2
         ) * dVar5;
    outre2_local[tmp1r._4_4_] = (dVar3 * dVar1 + -(dVar4 * dVar2)) * dVar5;
  }
  return;
}

Assistant:

void WebRtcIsac_Spec2time(const TransformTables* tables,
                          double* inre,
                          double* inim,
                          double* outre1,
                          double* outre2,
                          FFTstr* fftstr_obj) {
  int k;
  double tmp1r, tmp1i, xr, xi, yr, yi, fact;

  int dims;

  dims = FRAMESAMPLES_HALF;

  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    /* Move zero in time to beginning of frames */
    tmp1r = tables->costab2[k];
    tmp1i = tables->sintab2[k];
    xr = inre[k] * tmp1r + inim[k] * tmp1i;
    xi = inim[k] * tmp1r - inre[k] * tmp1i;
    yr = -inim[FRAMESAMPLES_HALF - 1 - k] * tmp1r - inre[FRAMESAMPLES_HALF - 1 - k] * tmp1i;
    yi = -inre[FRAMESAMPLES_HALF - 1 - k] * tmp1r + inim[FRAMESAMPLES_HALF - 1 - k] * tmp1i;

    /* Combine into one vector,  z = x + j * y */
    outre1[k] = xr - yi;
    outre1[FRAMESAMPLES_HALF - 1 - k] = xr + yi;
    outre2[k] = xi + yr;
    outre2[FRAMESAMPLES_HALF - 1 - k] = -xi + yr;
  }


  /* Get IDFT */
  WebRtcIsac_Fftns(1, &dims, outre1, outre2, 1, FRAMESAMPLES_HALF, fftstr_obj);


  /* Demodulate and separate */
  fact = sqrt(FRAMESAMPLES_HALF);
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tmp1r = tables->costab1[k];
    tmp1i = tables->sintab1[k];
    xr = (outre1[k] * tmp1r - outre2[k] * tmp1i) * fact;
    outre2[k] = (outre2[k] * tmp1r + outre1[k] * tmp1i) * fact;
    outre1[k] = xr;
  }
}